

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O3

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::set_up_values_of_landscapes
          (Persistence_landscape_on_grid *this,
          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *p,
          double grid_min_,double grid_max_,size_t number_of_points_,uint number_of_levels)

{
  vector<double,std::allocator<double>> *pvVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double *pdVar8;
  pointer ppVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  pointer pvVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  iterator iVar19;
  long lVar20;
  long lVar21;
  size_t i;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  pointer pvVar25;
  _Iter_less_iter __comp;
  double local_a8;
  allocator_type local_99;
  double local_98;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *local_90;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_88;
  ulong local_68;
  ulong local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_58;
  long local_38;
  
  local_a8 = grid_max_;
  if (((grid_min_ == 1.79769313486232e+308) && (!NAN(grid_min_))) ||
     ((local_98 = grid_min_, grid_max_ == 1.79769313486232e+308 && (!NAN(grid_max_))))) {
    ppVar9 = (p->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar18 = (long)(p->
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9;
    if (lVar18 == 0) {
      dVar22 = 1.79769313486232e+308;
      local_a8 = 2.2250738585072014e-308;
    }
    else {
      lVar18 = lVar18 >> 4;
      pdVar8 = &ppVar9->second;
      local_a8 = 2.2250738585072014e-308;
      dVar22 = 1.79769313486232e+308;
      do {
        dVar7 = ((pair<double,_double> *)(pdVar8 + -1))->first;
        if (dVar22 <= ((pair<double,_double> *)(pdVar8 + -1))->first) {
          dVar7 = dVar22;
        }
        dVar22 = dVar7;
        dVar7 = *pdVar8;
        if (*pdVar8 <= local_a8) {
          dVar7 = local_a8;
        }
        local_a8 = dVar7;
        pdVar8 = pdVar8 + 2;
        lVar18 = lVar18 + -1;
      } while (lVar18 != 0);
    }
    if ((grid_min_ == 1.79769313486232e+308) && (!NAN(grid_min_))) {
      local_a8 = grid_max_;
    }
    local_98 = grid_min_;
    if ((grid_min_ == 1.79769313486232e+308) && (local_98 = grid_min_, !NAN(grid_min_))) {
      local_98 = dVar22;
    }
  }
  local_90 = p;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_58,number_of_points_ + 1,&local_99);
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->values_of_landscapes).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->values_of_landscapes).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->values_of_landscapes).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_58);
  this->grid_min = local_98;
  this->grid_max = local_a8;
  if (local_a8 <= local_98) {
    puVar13 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar13 = 
    "Wrong parameters of grid_min and grid_max given to the procedure. The program will now terminate.\n"
    ;
    __cxa_throw(puVar13,&char_const*::typeinfo,0);
  }
  ppVar9 = (local_90->
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((local_90->
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppVar9) {
    auVar23._8_4_ = (int)(number_of_points_ >> 0x20);
    auVar23._0_8_ = number_of_points_;
    auVar23._12_4_ = 0x45300000;
    pvVar25 = (pointer)((local_a8 - local_98) /
                       ((auVar23._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)number_of_points_) - 4503599627370496.0)));
    local_60 = (ulong)number_of_levels;
    local_68 = (ulong)(number_of_levels - 1);
    lVar18 = 0;
    do {
      dVar22 = (ppVar9[lVar18].first - local_98) / (double)pvVar25;
      uVar10 = (ulong)dVar22;
      uVar10 = (long)(dVar22 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
      dVar22 = (ppVar9[lVar18].second - local_98) / (double)pvVar25;
      uVar11 = (ulong)dVar22;
      uVar11 = (long)(dVar22 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
      lVar20 = uVar10 + uVar11;
      auVar24._8_4_ = (int)((ulong)lVar20 >> 0x20);
      auVar24._0_8_ = lVar20;
      auVar24._12_4_ = 0x45300000;
      dVar22 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0)) * 0.5;
      uVar12 = (ulong)dVar22;
      uVar12 = (long)(dVar22 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12;
      uVar10 = uVar10 + 1;
      local_88.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pvVar25;
      local_38 = lVar18;
      if (uVar10 < uVar12) {
        do {
          pvVar15 = (this->values_of_landscapes).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar1 = (vector<double,std::allocator<double>> *)(pvVar15 + uVar10);
          iVar19._M_current = *(double **)(pvVar1 + 8);
          if (number_of_levels == 0xffffffff) {
            if (iVar19._M_current == *(double **)(pvVar1 + 0x10)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (pvVar1,iVar19,(double *)&local_88);
            }
            else {
              *iVar19._M_current =
                   (double)local_88.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              *(double **)(pvVar1 + 8) = iVar19._M_current + 1;
            }
          }
          else {
            pdVar8 = *(double **)pvVar1;
            uVar14 = (long)iVar19._M_current - (long)pdVar8 >> 3;
            if (uVar14 < local_60) {
              local_58.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_88.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start ^ 0x8000000000000000);
              if (iVar19._M_current == *(double **)(pvVar1 + 0x10)) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)pvVar1,iVar19,
                           (double *)&local_58);
                pvVar15 = (this->values_of_landscapes).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                *iVar19._M_current =
                     (double)local_58.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                *(double **)(pvVar1 + 8) = iVar19._M_current + 1;
              }
              _Var2._M_current =
                   pvVar15[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
              _Var3._M_current =
                   *(pointer *)
                    ((long)&pvVar15[uVar10].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8);
              if ((long)_Var3._M_current - (long)_Var2._M_current >> 3 == local_68) {
                std::
                __make_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (_Var2,_Var3,(_Iter_less_iter *)&local_58);
              }
            }
            else {
              dVar22 = -(double)local_88.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
              if (dVar22 < *pdVar8) {
                if (8 < (long)iVar19._M_current - (long)pdVar8) {
                  dVar22 = iVar19._M_current[-1];
                  iVar19._M_current[-1] = *pdVar8;
                  std::
                  __adjust_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,double,__gnu_cxx::__ops::_Iter_less_iter>
                            (dVar22,pdVar8,0,(long)iVar19._M_current + (-8 - (long)pdVar8) >> 3);
                  pvVar15 = (this->values_of_landscapes).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pdVar8 = pvVar15[uVar10].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  iVar19._M_current =
                       *(pointer *)
                        ((long)&pvVar15[uVar10].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8);
                  dVar22 = -(double)local_88.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                  uVar14 = (long)iVar19._M_current - (long)pdVar8 >> 3;
                }
                uVar17 = uVar14 - 1;
                pdVar8[uVar14 - 1] = dVar22;
                dVar22 = iVar19._M_current[-1];
                if (1 < (long)uVar14) {
                  do {
                    uVar14 = uVar17 - 1;
                    uVar16 = uVar14 >> 1;
                    if (dVar22 <= pdVar8[uVar16]) goto LAB_00104424;
                    pdVar8[uVar17] = pdVar8[uVar16];
                    uVar17 = uVar16;
                  } while (1 < uVar14);
                  uVar17 = 0;
                }
LAB_00104424:
                pdVar8[uVar17] = dVar22;
              }
            }
          }
          local_88.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((double)local_88.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (double)pvVar25);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar12);
      }
      for (; uVar12 <= uVar11; uVar12 = uVar12 + 1) {
        if (0.0 < (double)local_88.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
          pvVar15 = (this->values_of_landscapes).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar1 = (vector<double,std::allocator<double>> *)(pvVar15 + uVar12);
          iVar19._M_current = *(double **)(pvVar1 + 8);
          if (number_of_levels == 0xffffffff) {
            if (iVar19._M_current == *(double **)(pvVar1 + 0x10)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (pvVar1,iVar19,(double *)&local_88);
            }
            else {
              *iVar19._M_current =
                   (double)local_88.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              *(double **)(pvVar1 + 8) = iVar19._M_current + 1;
            }
          }
          else {
            pdVar8 = *(double **)pvVar1;
            uVar10 = (long)iVar19._M_current - (long)pdVar8 >> 3;
            if (uVar10 < local_60) {
              local_58.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_88.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start ^ 0x8000000000000000);
              if (iVar19._M_current == *(double **)(pvVar1 + 0x10)) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)pvVar1,iVar19,
                           (double *)&local_58);
                pvVar15 = (this->values_of_landscapes).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                *iVar19._M_current =
                     (double)local_58.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                *(double **)(pvVar1 + 8) = iVar19._M_current + 1;
              }
              _Var2._M_current =
                   pvVar15[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
              _Var3._M_current =
                   *(pointer *)
                    ((long)&pvVar15[uVar12].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8);
              if ((long)_Var3._M_current - (long)_Var2._M_current >> 3 == local_68) {
                std::
                __make_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (_Var2,_Var3,(_Iter_less_iter *)&local_58);
              }
            }
            else {
              dVar22 = -(double)local_88.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
              if (dVar22 < *pdVar8) {
                if (8 < (long)iVar19._M_current - (long)pdVar8) {
                  dVar22 = iVar19._M_current[-1];
                  iVar19._M_current[-1] = *pdVar8;
                  std::
                  __adjust_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,double,__gnu_cxx::__ops::_Iter_less_iter>
                            (dVar22,pdVar8,0,(long)iVar19._M_current + (-8 - (long)pdVar8) >> 3);
                  pvVar15 = (this->values_of_landscapes).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pdVar8 = pvVar15[uVar12].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  iVar19._M_current =
                       *(pointer *)
                        ((long)&pvVar15[uVar12].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8);
                  dVar22 = -(double)local_88.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                  uVar10 = (long)iVar19._M_current - (long)pdVar8 >> 3;
                }
                uVar14 = uVar10 - 1;
                pdVar8[uVar10 - 1] = dVar22;
                dVar22 = iVar19._M_current[-1];
                if (1 < (long)uVar10) {
                  do {
                    uVar10 = uVar14 - 1;
                    uVar17 = uVar10 >> 1;
                    if (dVar22 <= pdVar8[uVar17]) goto LAB_001045bd;
                    pdVar8[uVar14] = pdVar8[uVar17];
                    uVar14 = uVar17;
                  } while (1 < uVar10);
                  uVar14 = 0;
                }
LAB_001045bd:
                pdVar8[uVar14] = dVar22;
              }
            }
          }
        }
        local_88.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((double)local_88.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (double)pvVar25);
      }
      lVar18 = local_38 + 1;
      ppVar9 = (local_90->
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar18 != (long)(local_90->
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 4);
  }
  pvVar25 = (this->values_of_landscapes).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar15 = (this->values_of_landscapes).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((number_of_levels != 0xffffffff) && ((long)pvVar15 - (long)pvVar25 != 0)) {
    lVar18 = 0;
    do {
      pdVar4 = pvVar25[lVar18].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar20 = (long)pvVar25[lVar18].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar4;
      if (lVar20 != 0) {
        lVar21 = 0;
        do {
          pdVar4[lVar21] = -pdVar4[lVar21];
          lVar21 = lVar21 + 1;
        } while (lVar20 >> 3 != lVar21);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != ((long)pvVar15 - (long)pvVar25 >> 3) * -0x5555555555555555);
  }
  if (pvVar15 != pvVar25) {
    lVar20 = 8;
    lVar18 = 0;
    do {
      lVar21 = *(long *)((long)pvVar25 + lVar20 + -8);
      lVar5 = *(long *)((long)&(pvVar25->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar20);
      if (lVar21 != lVar5) {
        uVar12 = lVar5 - lVar21 >> 3;
        lVar6 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                  (lVar21,lVar5,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                  (lVar21,lVar5);
        pvVar25 = (this->values_of_landscapes).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar15 = (this->values_of_landscapes).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x18;
    } while (lVar18 != ((long)pvVar15 - (long)pvVar25 >> 3) * -0x5555555555555555);
  }
  return;
}

Assistant:

void Persistence_landscape_on_grid::set_up_values_of_landscapes(const std::vector<std::pair<double, double> >& p,
                                                                double grid_min_, double grid_max_,
                                                                size_t number_of_points_, unsigned number_of_levels) {
  bool dbg = false;
  if (dbg) {
    std::clog << "Here is the procedure : set_up_values_of_landscapes. The parameters are : grid_min_ : " << grid_min_
              << ", grid_max_ : " << grid_max_ << ", number_of_points_ : " << number_of_points_
              << ", number_of_levels: " << number_of_levels << std::endl;
    std::clog << "Here are the intervals at our disposal : \n";
    for (size_t i = 0; i != p.size(); ++i) {
      std::clog << p[i].first << " , " << p[i].second << std::endl;
    }
  }

  if ((grid_min_ == std::numeric_limits<double>::max()) || (grid_max_ == std::numeric_limits<double>::max())) {
    // in this case, we need to find grid_min_ and grid_min_ based on the data.
    double min = std::numeric_limits<double>::max();
    double max = std::numeric_limits<double>::min();
    for (size_t i = 0; i != p.size(); ++i) {
      if (p[i].first < min) min = p[i].first;
      if (p[i].second > max) max = p[i].second;
    }
    if (grid_min_ == std::numeric_limits<double>::max()) {
      grid_min_ = min;
    } else {
      // in this case grid_max_ == std::numeric_limits<double>::max()
      grid_max_ = max;
    }
  }

  // if number_of_levels == std::numeric_limits<size_t>::max(), then we will have all the nonzero values of landscapes,
  // and will store them in a vector
  // if number_of_levels != std::numeric_limits<size_t>::max(), then we will use those vectors as heaps.
  this->values_of_landscapes = std::vector<std::vector<double> >(number_of_points_ + 1);

  this->grid_min = grid_min_;
  this->grid_max = grid_max_;

  if (grid_max_ <= grid_min_) {
    throw "Wrong parameters of grid_min and grid_max given to the procedure. The program will now terminate.\n";
  }

  double dx = (grid_max_ - grid_min_) / static_cast<double>(number_of_points_);
  // for every interval in the diagram:
  for (size_t int_no = 0; int_no != p.size(); ++int_no) {
    size_t grid_interval_begin = (p[int_no].first - grid_min_) / dx;
    size_t grid_interval_end = (p[int_no].second - grid_min_) / dx;
    size_t grid_interval_midpoint = (size_t)(0.5 * (grid_interval_begin + grid_interval_end));

    if (dbg) {
      std::clog << "Considering an interval : " << p[int_no].first << "," << p[int_no].second << std::endl;

      std::clog << "grid_interval_begin : " << grid_interval_begin << std::endl;
      std::clog << "grid_interval_end : " << grid_interval_end << std::endl;
      std::clog << "grid_interval_midpoint : " << grid_interval_midpoint << std::endl;
    }

    double landscape_value = dx;
    for (size_t i = grid_interval_begin + 1; i < grid_interval_midpoint; ++i) {
      if (dbg) {
        std::clog << "Adding landscape value (going up) for a point : " << i << " equal : " << landscape_value
                  << std::endl;
      }
      if (number_of_levels != std::numeric_limits<unsigned>::max()) {
        // we have a heap of no more that number_of_levels values.
        // Note that if we are using heaps, we want to know the shortest distance in the heap.
        // This is achieved by putting -distance to the heap.
        if (this->values_of_landscapes[i].size() >= number_of_levels) {
          // in this case, the full heap is build, and we need to check if the landscape_value is not larger than the
          // smallest element in the heap.
          if (-landscape_value < this->values_of_landscapes[i].front()) {
            // if it is, we remove the largest value in the heap, and move on.
            std::pop_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] = -landscape_value;
            std::push_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
          }
        } else {
          // in this case we are still filling in the array.
          this->values_of_landscapes[i].push_back(-landscape_value);
          if (this->values_of_landscapes[i].size() == number_of_levels - 1) {
            // this->values_of_landscapes[i].size() == number_of_levels
            // in this case we need to create the heap.
            std::make_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
          }
        }
      } else {
        // we have vector of all values
        this->values_of_landscapes[i].push_back(landscape_value);
      }
      landscape_value += dx;
    }
    for (size_t i = grid_interval_midpoint; i <= grid_interval_end; ++i) {
      if (landscape_value > 0) {
        if (number_of_levels != std::numeric_limits<unsigned>::max()) {
          // we have a heap of no more that number_of_levels values
          if (this->values_of_landscapes[i].size() >= number_of_levels) {
            // in this case, the full heap is build, and we need to check if the landscape_value is not larger than the
            // smallest element in the heap.
            if (-landscape_value < this->values_of_landscapes[i].front()) {
              // if it is, we remove the largest value in the heap, and move on.
              std::pop_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
              this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] = -landscape_value;
              std::push_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            }
          } else {
            // in this case we are still filling in the array.
            this->values_of_landscapes[i].push_back(-landscape_value);
            if (this->values_of_landscapes[i].size() == number_of_levels - 1) {
              // this->values_of_landscapes[i].size() == number_of_levels
              // in this case we need to create the heap.
              std::make_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            }
          }
        } else {
          this->values_of_landscapes[i].push_back(landscape_value);
        }

        if (dbg) {
          std::clog << "Adding landscape value (going down) for a point : " << i << " equal : " << landscape_value
                    << std::endl;
        }
      }
      landscape_value -= dx;
    }
  }

  if (number_of_levels != std::numeric_limits<unsigned>::max()) {
    // in this case, vectors are used as heaps. And, since we want to have the smallest element at the top of
    // each heap, we store minus distances. To get if right at the end, we need to multiply each value
    // in the heap by -1 to get real vector of distances.
    for (size_t pt = 0; pt != this->values_of_landscapes.size(); ++pt) {
      for (size_t j = 0; j != this->values_of_landscapes[pt].size(); ++j) {
        this->values_of_landscapes[pt][j] *= -1;
      }
    }
  }

  // and now we need to sort the values:
  for (size_t pt = 0; pt != this->values_of_landscapes.size(); ++pt) {
    std::sort(this->values_of_landscapes[pt].begin(), this->values_of_landscapes[pt].end(), std::greater<double>());
  }
}